

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test13(char *infile,char *password,char *outfile,char *xarg)

{
  undefined8 uVar1;
  
  qpdf_read(qpdf,infile,password);
  uVar1 = qpdf_get_user_password(qpdf);
  printf("user password: %s\n",uVar1);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_preserve_encryption(qpdf,0);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test13(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    printf("user password: %s\n", qpdf_get_user_password(qpdf));
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_preserve_encryption(qpdf, QPDF_FALSE);
    qpdf_write(qpdf);
    report_errors();
}